

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeFilteringTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  FilterMode FVar2;
  FilterMode FVar3;
  TestLog *pTVar4;
  TestContext *pTVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  deUint32 width;
  deUint32 height;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  pointer pFVar10;
  long lVar11;
  undefined4 extraout_var_01;
  byte bVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  CubeFace face;
  CubeFace face_00;
  int *piVar16;
  undefined1 auVar17 [16];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  LodPrecision local_34c;
  TestTextureCube *local_340;
  LookupPrecision local_338;
  PixelFormat pixelFormat;
  IVec4 colorBits;
  TextureFormat texFmt;
  IVec4 formatBitDepth;
  undefined1 local_2b8 [16];
  TestLog local_2a8 [2];
  int local_298;
  anon_union_16_3_1194ccdc_for_v aStack_294;
  undefined4 uStack_284;
  DepthStencilMode DStack_280;
  ios_base local_240 [272];
  ConstPixelBufferAccess local_130;
  undefined1 local_104 [76];
  long lStack_b8;
  qpTestLog *local_b0;
  undefined8 uStack_a8;
  int local_a0;
  bool local_8c;
  undefined7 uStack_8b;
  LodMode local_84;
  TextureFormatInfo fmtInfo;
  undefined4 extraout_var_00;
  
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  local_340 = util::TextureRenderer::getCubeTexture
                        (this_00,(this->m_cases).
                                 super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->m_caseNdx].
                                 textureIndex);
  iVar9 = (*(local_340->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar9);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar10 = (this->m_cases).
            super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_104,TEXTURETYPE_CUBE);
  util::createSampler((Sampler *)local_2b8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_a0 = local_298;
  local_b0 = local_2a8[0].m_log;
  uStack_a8 = local_2a8[1].m_log;
  local_104._68_8_ = local_2b8._0_8_;
  lStack_b8 = local_2b8._8_8_;
  uStack_8b = (undefined7)(CONCAT44(DStack_280,uStack_284) >> 8);
  local_8c = true;
  local_104._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_84 = LODMODE_EXACT;
  local_104._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_104._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_104._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_104._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_104._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_104._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_104._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_104._48_4_ = fmtInfo.lookupScale.m_data[3];
  poVar1 = (ostringstream *)(local_2b8 + 8);
  local_2b8._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)poVar1,&pFVar10->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," -> ",4);
  tcu::operator<<((ostream *)poVar1,&pFVar10->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_240);
  face_00 = CUBEFACE_NEGATIVE_X;
  piVar16 = &DAT_00b28510;
  do {
    width = util::TextureRenderer::getRenderWidth(this_00);
    height = util::TextureRenderer::getRenderHeight(this_00);
    tcu::Surface::Surface(&rendered,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face_00,&pFVar10->bottomLeft,&pFVar10->topRight);
    poVar1 = (ostringstream *)(local_2b8 + 8);
    local_2b8._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Face ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)((long)&DAT_00b28510 + (long)*piVar16),2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_240);
    util::TextureRenderer::renderQuad
              (this_00,&rendered,pFVar10->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    FVar2 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.magFilter;
    FVar3 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.minFilter;
    local_2b8._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_2b8);
    uVar14 = (FVar2 == NEAREST && FVar3 == NEAREST) | 0xfffffffe;
    pixelFormat.redBits = formatBitDepth.m_data[0];
    pixelFormat.greenBits = formatBitDepth.m_data[1];
    pixelFormat.blueBits = formatBitDepth.m_data[2];
    pixelFormat.alphaBits = formatBitDepth.m_data[3];
    colorBits.m_data[0] =
         -(uint)(0 < (int)(uVar14 + formatBitDepth.m_data[0])) & uVar14 + formatBitDepth.m_data[0];
    colorBits.m_data[1] =
         -(uint)(0 < (int)(uVar14 + formatBitDepth.m_data[1])) & uVar14 + formatBitDepth.m_data[1];
    colorBits.m_data[2] =
         -(uint)(0 < (int)(uVar14 + formatBitDepth.m_data[2])) & uVar14 + formatBitDepth.m_data[2];
    colorBits.m_data[3] =
         -(uint)(0 < (int)(uVar14 + formatBitDepth.m_data[3])) & uVar14 + formatBitDepth.m_data[3];
    local_34c.rule = RULE_VULKAN;
    local_338.coordBits.m_data[0] = 0x16;
    local_338.coordBits.m_data[1] = 0x16;
    local_338.coordBits.m_data[2] = 0x16;
    local_338.uvwBits.m_data[0] = 0x10;
    local_338.uvwBits.m_data[1] = 0x10;
    local_338.uvwBits.m_data[2] = 0x10;
    local_338.colorThreshold.m_data[0] = 0.0;
    local_338.colorThreshold.m_data[1] = 0.0;
    local_338.colorThreshold.m_data[2] = 0.0;
    local_338.colorThreshold.m_data[3] = 0.0;
    local_338.colorMask.m_data[0] = true;
    local_338.colorMask.m_data[1] = true;
    local_338.colorMask.m_data[2] = true;
    local_338.colorMask.m_data[3] = true;
    local_34c.derivateBits = 10;
    local_34c.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)local_2b8,&colorBits);
    auVar6._8_8_ = local_2b8._8_8_;
    auVar6._0_8_ = local_2b8._0_8_;
    auVar7._8_8_ = local_104._44_8_;
    auVar7._0_8_ = local_104._36_8_;
    local_338.colorThreshold.m_data = (float  [4])divps(auVar6,auVar7);
    local_338.coordBits.m_data[0] = 10;
    local_338.coordBits.m_data[1] = 10;
    local_338.coordBits.m_data[2] = 10;
    local_338.uvwBits.m_data[0] = 6;
    local_338.uvwBits.m_data[1] = 6;
    local_338.uvwBits.m_data[2] = 0;
    auVar17._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar17._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar17._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar17._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar14 = movmskps(extraout_EAX,auVar17);
    bVar12 = (byte)uVar14;
    local_338.colorMask.m_data =
         (bool  [4])
         (uVar14 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
         (uint)(bVar12 >> 3) << 0x18);
    pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_2b8._0_8_ = (TestLog *)0x300000008;
    pvVar15 = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      pvVar15 = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_130,(TextureFormat *)local_2b8,rendered.m_width,
               rendered.m_height,1,pvVar15);
    iVar9 = (*(local_340->super_TestTexture)._vptr_TestTexture[0x10])();
    lVar11 = CONCAT44(extraout_var_00,iVar9);
    aStack_294.uData[3] = (deUint32)*(undefined8 *)(lVar11 + 0x160);
    uStack_284 = (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x160) >> 0x20);
    local_2b8._0_8_ = *(undefined8 *)(lVar11 + 0x130);
    local_2b8._8_8_ = *(long *)(lVar11 + 0x138);
    local_2a8[0].m_log = *(qpTestLog **)(lVar11 + 0x140);
    local_2a8[1].m_log = *(qpTestLog **)(lVar11 + 0x148);
    local_298 = (int)*(undefined8 *)(lVar11 + 0x150);
    aStack_294.uData[0] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x150) >> 0x20);
    aStack_294.uData[1] = (deUint32)*(undefined8 *)(lVar11 + 0x158);
    aStack_294.uData[2] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x158) >> 0x20);
    bVar8 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar5,&local_130,(TextureCubeView *)local_2b8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_104,&local_338,
                       &local_34c,&pixelFormat);
    if (!bVar8) {
      local_34c.lodBits = 4;
      local_338.uvwBits.m_data[0] = 4;
      local_338.uvwBits.m_data[1] = 4;
      local_338.uvwBits.m_data[2] = 0;
      poVar1 = (ostringstream *)(local_2b8 + 8);
      local_2b8._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_240);
      pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
      local_2b8._0_8_ = (TestLog *)0x300000008;
      pvVar15 = (void *)rendered.m_pixels.m_cap;
      if (rendered.m_pixels.m_cap != 0) {
        pvVar15 = rendered.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_130,(TextureFormat *)local_2b8,rendered.m_width,
                 rendered.m_height,1,pvVar15);
      iVar9 = (*(local_340->super_TestTexture)._vptr_TestTexture[0x10])();
      lVar11 = CONCAT44(extraout_var_01,iVar9);
      aStack_294.uData[3] = (deUint32)*(undefined8 *)(lVar11 + 0x160);
      uStack_284 = (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x160) >> 0x20);
      local_2b8._0_8_ = *(undefined8 *)(lVar11 + 0x130);
      local_2b8._8_8_ = *(long *)(lVar11 + 0x138);
      local_2a8[0].m_log = *(qpTestLog **)(lVar11 + 0x140);
      local_2a8[1].m_log = *(qpTestLog **)(lVar11 + 0x148);
      local_298 = (int)*(undefined8 *)(lVar11 + 0x150);
      aStack_294.uData[0] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x150) >> 0x20);
      aStack_294.uData[1] = (deUint32)*(undefined8 *)(lVar11 + 0x158);
      aStack_294.uData[2] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x158) >> 0x20);
      bVar8 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar5,&local_130,(TextureCubeView *)local_2b8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_104,&local_338,
                         &local_34c,&pixelFormat);
      if (!bVar8) {
        poVar1 = (ostringstream *)(local_2b8 + 8);
        local_2b8._0_8_ = pTVar4;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_240);
        local_2b8._0_8_ = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"Image verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_2b8._0_8_,
                   (long)(qpTestLog **)local_2b8._0_8_ + local_2b8._8_8_);
        if ((TestLog *)local_2b8._0_8_ != local_2a8) {
          operator_delete((void *)local_2b8._0_8_,(ulong)((long)&(local_2a8[0].m_log)->flags + 1));
        }
        if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        tcu::Surface::~Surface(&rendered);
        return __return_storage_ptr__;
      }
    }
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&rendered);
    face_00 = face_00 + CUBEFACE_POSITIVE_X;
    piVar16 = piVar16 + 1;
    if (face_00 == CUBEFACE_LAST) {
      iVar9 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar9;
      iVar13 = (int)((ulong)((long)(this->m_cases).
                                   super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_cases).
                                  super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      if (SBORROW4(iVar9,iVar13 * -0x33333333) == iVar9 + iVar13 * 0x33333333 < 0) {
        local_2b8._0_8_ = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Pass","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_2b8._0_8_,
                   (long)(qpTestLog **)local_2b8._0_8_ + local_2b8._8_8_);
        if ((TestLog *)local_2b8._0_8_ != local_2a8) {
          operator_delete((void *)local_2b8._0_8_,(ulong)((long)&(local_2a8[0].m_log)->flags + 1));
        }
      }
      else {
        tcu::TestStatus::incomplete();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const pipeline::TestTextureCube&	texture		= m_renderer.getCubeTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&					curCase		= m_cases[m_caseNdx];
	ReferenceParams						refParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	refParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.lodMode					= LODMODE_EXACT;
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;

	log << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], refParams);

		{
			const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
			const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
														   &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
													  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}